

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

idx_t duckdb::StrfTimeFormat::GetSpecifierLength
                (StrTimeSpecifier specifier,date_t date,int32_t *data,char *tz_name)

{
  uint uVar1;
  uint uVar2;
  short sVar3;
  short sVar4;
  ulong uVar5;
  uint32_t uVar6;
  int32_t iVar7;
  int iVar8;
  size_t sVar9;
  idx_t iVar10;
  InternalException *pIVar11;
  undefined7 in_register_00000039;
  bool bVar12;
  bool bVar13;
  string local_40 [4];
  char local_30 [16];
  
  switch((int)CONCAT71(in_register_00000039,specifier)) {
  case 1:
    iVar7 = Date::ExtractISODayOfTheWeek(date);
    iVar10 = (ulong)*(uint *)(Date::DAY_NAMES + (long)(iVar7 % 7) * 0x10);
    break;
  default:
    pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
    _local_40 = local_30;
    ::std::__cxx11::string::_M_construct<char_const*>
              (local_40,"Unimplemented specifier for GetSpecifierLength","");
    InternalException::InternalException(pIVar11,(string *)local_40);
    __cxa_throw(pIVar11,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 4:
    uVar6 = data[2];
    goto LAB_0111f7c7;
  case 6:
    iVar10 = (ulong)*(uint *)(Date::MONTH_NAMES_ABBREVIATED + (long)data[1] * 0x10 + 0xb0);
    break;
  case 8:
    bVar13 = SBORROW4(data[1],10);
    bVar12 = data[1] + -10 < 0;
    goto LAB_0111f7de;
  case 10:
    uVar1 = *data;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    uVar6 = uVar2 % 100;
    goto LAB_0111f7c7;
  case 0xb:
    uVar1 = *data;
    if (uVar1 < 10000) {
      return 4;
    }
    uVar6 = -uVar1;
    if (0 < (int)uVar1) {
      uVar6 = uVar1;
    }
    iVar8 = NumericHelper::UnsignedLength<unsigned_int>(uVar6);
    iVar8 = iVar8 - ((int)uVar1 >> 0x1f);
    goto LAB_0111f7cc;
  case 0xd:
  case 0xf:
  case 0x12:
  case 0x14:
    if (7 < specifier - 0xd) {
switchD_0111f68d_caseD_e:
      pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
      _local_40 = local_30;
      ::std::__cxx11::string::_M_construct<char_const*>(local_40,"Time specifier mismatch","");
      InternalException::InternalException(pIVar11,(string *)local_40);
      __cxa_throw(pIVar11,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar8 = data[3];
    switch((uint)specifier) {
    case 0xd:
      bVar13 = SBORROW4(iVar8,10);
      bVar12 = iVar8 + -10 < 0;
      break;
    default:
      goto switchD_0111f68d_caseD_e;
    case 0xf:
      iVar8 = iVar8 + (((uint)(iVar8 / 6 + (iVar8 >> 0x1f)) >> 1) - (iVar8 >> 0x1f)) * -0xc;
      bVar12 = 9 < iVar8 || iVar8 == 0;
      goto LAB_0111f7e1;
    case 0x12:
      bVar13 = SBORROW4(data[4],10);
      bVar12 = data[4] + -10 < 0;
      break;
    case 0x14:
      bVar13 = SBORROW4(data[5],10);
      bVar12 = data[5] + -10 < 0;
    }
LAB_0111f7de:
    bVar12 = bVar13 == bVar12;
LAB_0111f7e1:
    iVar10 = (ulong)bVar12 + 1;
    break;
  case 0x17:
    iVar8 = data[7];
    sVar4 = (short)(uint)((ulong)((long)iVar8 * 0x91a2b3c5) >> 0x2b) - (short)(iVar8 >> 0x1f);
    sVar3 = (short)iVar8;
    iVar10 = 9;
    if ((ushort)((ushort)((sVar3 + sVar4 * -0xe10) * -0x1111 + 0x888U) >> 2 | sVar3 * -0x4000) <
        0x445) {
      iVar10 = (ulong)(0x76 < (ushort)(sVar3 + sVar4 * -0xe10 + 0x3bU)) * 3 + 3;
    }
    break;
  case 0x18:
    if (tz_name != (char *)0x0) {
      sVar9 = strlen(tz_name);
      return sVar9;
    }
    iVar10 = 0;
    break;
  case 0x1a:
    uVar5 = (ulong)_local_40 >> 0x20;
    uVar6 = Date::ExtractDayOfTheYear((date_t)(int32_t)uVar5);
LAB_0111f7c7:
    iVar8 = NumericHelper::UnsignedLength<unsigned_int>(uVar6);
LAB_0111f7cc:
    iVar10 = (long)iVar8;
  }
  return iVar10;
}

Assistant:

idx_t StrfTimeFormat::GetSpecifierLength(StrTimeSpecifier specifier, date_t date, int32_t data[8],
                                         const char *tz_name) {
	switch (specifier) {
	case StrTimeSpecifier::FULL_WEEKDAY_NAME:
		return Date::DAY_NAMES[Date::ExtractISODayOfTheWeek(date) % 7].GetSize();
	case StrTimeSpecifier::FULL_MONTH_NAME:
		return Date::MONTH_NAMES[data[1] - 1].GetSize();
	case StrTimeSpecifier::YEAR_DECIMAL: {
		auto year = data[0];
		// Be consistent with WriteStandardSpecifier
		if (0 <= year && year <= 9999) {
			return 4;
		} else {
			return UnsafeNumericCast<idx_t>(NumericHelper::SignedLength<int32_t, uint32_t>(year));
		}
	}
	case StrTimeSpecifier::MONTH_DECIMAL: {
		idx_t len = 1;
		auto month = data[1];
		len += month >= 10;
		return len;
	}
	case StrTimeSpecifier::UTC_OFFSET: {
		// ±HH or ±HH:MM or ±HH:MM:SS
		int hh, mm, ss;
		StrfTimeSplitOffset(data[7], hh, mm, ss);
		return ss ? 9 : (mm ? 6 : 3);
	}
	case StrTimeSpecifier::TZ_NAME:
		if (tz_name) {
			return strlen(tz_name);
		}
		// empty for now
		return 0;
	case StrTimeSpecifier::HOUR_24_DECIMAL:
	case StrTimeSpecifier::HOUR_12_DECIMAL:
	case StrTimeSpecifier::MINUTE_DECIMAL:
	case StrTimeSpecifier::SECOND_DECIMAL: {
		// time specifiers
		idx_t len = 1;
		int32_t hour = data[3], min = data[4], sec = data[5];
		switch (specifier) {
		case StrTimeSpecifier::HOUR_24_DECIMAL:
			len += hour >= 10;
			break;
		case StrTimeSpecifier::HOUR_12_DECIMAL:
			hour = hour % 12;
			if (hour == 0) {
				hour = 12;
			}
			len += hour >= 10;
			break;
		case StrTimeSpecifier::MINUTE_DECIMAL:
			len += min >= 10;
			break;
		case StrTimeSpecifier::SECOND_DECIMAL:
			len += sec >= 10;
			break;
		default:
			throw InternalException("Time specifier mismatch");
		}
		return len;
	}
	case StrTimeSpecifier::DAY_OF_MONTH:
		return UnsafeNumericCast<idx_t>(NumericHelper::UnsignedLength<uint32_t>(UnsafeNumericCast<uint32_t>(data[2])));
	case StrTimeSpecifier::DAY_OF_YEAR_DECIMAL:
		return UnsafeNumericCast<idx_t>(
		    NumericHelper::UnsignedLength<uint32_t>(UnsafeNumericCast<uint32_t>(Date::ExtractDayOfTheYear(date))));
	case StrTimeSpecifier::YEAR_WITHOUT_CENTURY:
		return UnsafeNumericCast<idx_t>(
		    NumericHelper::UnsignedLength<uint32_t>(UnsafeNumericCast<uint32_t>(AbsValue(data[0]) % 100)));
	default:
		throw InternalException("Unimplemented specifier for GetSpecifierLength");
	}
}